

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.cpp
# Opt level: O1

size_t pstore::command_line::details::widest_option(categories_collection *categories)

{
  _Base_ptr p_Var1;
  size_t sVar2;
  options_set *in_RDX;
  _Rb_tree_header *p_Var3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  _Base_ptr p_Var7;
  undefined1 auVar8 [16];
  _Rb_tree<pstore::gsl::not_null<const_pstore::command_line::option_*>,_std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>,_std::_Select1st<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>,_pstore::command_line::details::less_name,_std::allocator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>_>
  local_60;
  
  p_Var7 = (categories->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(categories->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 == p_Var3) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    do {
      get_switch_strings_abi_cxx11_
                ((switch_strings *)&local_60,(details *)&p_Var7[1]._M_parent,in_RDX);
      for (p_Var1 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var1 != &local_60._M_impl.super__Rb_tree_header;
          p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
        if (p_Var1[1]._M_parent != (_Base_ptr)0x0) {
          lVar5 = 0;
          uVar6 = uVar4;
          do {
            uVar4 = *(ulong *)((long)&(p_Var1[3]._M_left)->_M_color + lVar5);
            if (uVar4 < uVar6) {
              uVar4 = uVar6;
            }
            lVar5 = lVar5 + 0x28;
            uVar6 = uVar4;
          } while ((long)p_Var1[1]._M_parent * 0x28 != lVar5);
        }
      }
      std::
      _Rb_tree<pstore::gsl::not_null<const_pstore::command_line::option_*>,_std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>,_std::_Select1st<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>,_pstore::command_line::details::less_name,_std::allocator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>_>
      ::~_Rb_tree(&local_60);
      auVar8 = std::_Rb_tree_increment(p_Var7);
      in_RDX = auVar8._8_8_;
      p_Var7 = auVar8._0_8_;
    } while ((_Rb_tree_header *)p_Var7 != p_Var3);
  }
  sVar2 = 0x14;
  if (uVar4 < 0x14) {
    sVar2 = uVar4;
  }
  return sVar2;
}

Assistant:

std::size_t widest_option (categories_collection const & categories) {
                    auto max_name_len = std::size_t{0};
                    for (auto const & cat : categories) {
                        for (auto const & sw : get_switch_strings (cat.second)) {
                            for (std::tuple<std::string, std::size_t> const & name : sw.second) {
                                max_name_len =
                                    std::max (max_name_len, std::get<std::size_t> (name));
                            }
                        }
                    }
                    return std::min (max_name_len, overlong_opt_max);
                }